

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O3

void __thiscall cmDebugger_impl::ClearAllBreakpoints(cmDebugger_impl *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->breakpointMutex);
  if (iVar1 == 0) {
    std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::_M_erase_at_end
              (&this->breakpoints,
               (this->breakpoints).super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>.
               _M_impl.super__Vector_impl_data._M_start);
    pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ClearAllBreakpoints() override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    breakpoints.clear();
  }